

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_compute_blob.h
# Opt level: O0

float __thiscall
ncnn::compute_coord<(ncnn::GridSample::PaddingMode)3,_false>::operator()
          (compute_coord<(ncnn::GridSample::PaddingMode)3,_false> *this,int length,float coord)

{
  float *pfVar1;
  int in_ESI;
  float in_XMM0_Da;
  float fVar2;
  double dVar3;
  float local_18;
  float local_14;
  float local_10;
  int local_c;
  
  local_c = in_ESI;
  dVar3 = std::fabs((double)(ulong)(uint)(in_XMM0_Da + 0.5));
  local_10 = SUB84(dVar3,0);
  fVar2 = (float)local_c;
  dVar3 = std::fabs((double)(ulong)(uint)(local_10 - (float)local_c));
  local_10 = (fVar2 - SUB84(dVar3,0)) - 0.5;
  local_14 = (float)local_c - 1.0;
  local_18 = 0.0;
  pfVar1 = std::max<float>(&local_10,&local_18);
  pfVar1 = std::min<float>(&local_14,pfVar1);
  return *pfVar1;
}

Assistant:

float operator()(int length, float coord)
    {
        coord = fabs(coord + 0.5f);
        coord = length - fabs(coord - length) - 0.5;

        return std::min(length - 1.0f, std::max(coord, 0.0f));
    }